

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calls.cpp
# Opt level: O0

RWNode * __thiscall
dg::dda::LLVMReadWriteGraphBuilder::createIntrinsicCall
          (LLVMReadWriteGraphBuilder *this,CallInst *CInst)

{
  Offset o;
  bool bVar1;
  ID IVar2;
  int iVar3;
  Value *val;
  Value *pVVar4;
  RWNode *this_00;
  type tVar5;
  undefined1 uVar6;
  Value *in_RSI;
  long in_RDI;
  undefined1 auVar7 [16];
  pair<std::_Rb_tree_const_iterator<const_llvm::Value_*>,_bool> pVar8;
  RWNode *target;
  Offset to;
  Offset from;
  LLVMPointer *ptr;
  const_iterator __end2;
  const_iterator __begin2;
  LLVMPointsToSet *__range2;
  ConstantInt *C;
  uint64_t len;
  pair<bool,_dg::LLVMPointsToSet> pts;
  RWNode *ret;
  Value *lenVal;
  Value *dest;
  IntrinsicInst *I;
  RWNode *in_stack_fffffffffffffe98;
  RWNodeType t;
  LLVMReadWriteGraphBuilder *in_stack_fffffffffffffea0;
  undefined7 in_stack_fffffffffffffea8;
  byte in_stack_fffffffffffffeaf;
  raw_ostream *in_stack_fffffffffffffeb0;
  raw_ostream *in_stack_fffffffffffffeb8;
  Offset *in_stack_fffffffffffffec0;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *this_01;
  RWNode *in_stack_fffffffffffffec8;
  LLVMReadWriteGraphBuilder *in_stack_fffffffffffffed0;
  ValInfo local_110;
  ValInfo local_108;
  _Base_ptr local_100;
  undefined1 in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff09;
  raw_ostream *in_stack_ffffffffffffff10;
  _Rb_tree_const_iterator<const_llvm::Value_*> os;
  LLVMReadWriteGraphBuilder *local_e0;
  Offset local_d8;
  Offset local_d0;
  type local_c8;
  Offset local_c0;
  Offset local_b8;
  Offset local_b0;
  Offset local_a8;
  undefined1 local_a0 [16];
  undefined8 *local_90;
  LLVMPointsToSetImpl *local_88;
  LLVMPointsToSetImpl *local_80;
  undefined1 *local_78;
  ret_type local_70;
  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
  *local_68;
  ValInfo local_60;
  byte local_58 [8];
  undefined1 auStack_50 [8];
  Offset local_48;
  Offset in_stack_ffffffffffffffc0;
  LLVMReadWriteGraphBuilder *in_stack_ffffffffffffffc8;
  RWNode *local_8;
  
  val = (Value *)llvm::cast<llvm::IntrinsicInst,llvm::CallInst_const>((CallInst *)0x19fb81);
  IVar2 = llvm::IntrinsicInst::getIntrinsicID((IntrinsicInst *)0x19fb96);
  t = (RWNodeType)((ulong)in_stack_fffffffffffffe98 >> 0x20);
  if (((IVar2 == 0xbf) || (IVar2 == 0xc2)) || (IVar2 == 0xc4)) {
    pVVar4 = llvm::CallBase::getOperand((CallBase *)in_stack_fffffffffffffea0,t);
    llvm::CallBase::getOperand
              ((CallBase *)in_stack_fffffffffffffea0,
               (uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    local_8 = create(in_stack_fffffffffffffea0,
                     (RWNodeType)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    (**(code **)(**(long **)(in_RDI + 0xd8) + 0x10))(local_58,*(long **)(in_RDI + 0xd8),pVVar4);
    local_e0 = in_stack_fffffffffffffea0;
    if ((local_58[0] & 1) == 0) {
      llvm::errs();
      llvm::raw_ostream::operator<<
                (in_stack_fffffffffffffeb0,
                 (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      in_stack_fffffffffffffec8 = (RWNode *)llvm::errs();
      ValInfo::ValInfo(&local_60,val);
      operator<<(in_stack_ffffffffffffff10,
                 (ValInfo *)CONCAT71(in_stack_ffffffffffffff09,in_stack_ffffffffffffff08));
      llvm::raw_ostream::operator<<
                (in_stack_fffffffffffffeb0,
                 (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
      local_e0 = in_stack_fffffffffffffea0;
    }
    local_68 = Offset::UNKNOWN;
    local_70 = llvm::dyn_cast<llvm::ConstantInt,llvm::Value_const>((Value *)local_e0);
    if (local_70 != (ret_type)0x0) {
      local_68 = (set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  *)llvm::ConstantInt::getLimitedValue
                              ((ConstantInt *)local_e0,(uint64_t)in_stack_fffffffffffffe98);
    }
    local_78 = auStack_50;
    local_80 = (LLVMPointsToSetImpl *)
               LLVMPointsToSet::begin((LLVMPointsToSet *)in_stack_fffffffffffffe98);
    local_88 = (LLVMPointsToSetImpl *)LLVMPointsToSet::end();
    while( true ) {
      bVar1 = LLVMPointsToSet::const_iterator::operator!=
                        ((const_iterator *)local_e0,(const_iterator *)in_stack_fffffffffffffe98);
      if (!bVar1) break;
      auVar7 = LLVMPointsToSet::const_iterator::operator*((const_iterator *)0x19fdfd);
      local_90 = (undefined8 *)local_a0;
      local_a0 = auVar7;
      bVar1 = llvm::isa<llvm::Function,llvm::Value*>((Value **)0x19fe2a);
      if (!bVar1) {
        Offset::Offset(&local_a8,(type)Offset::UNKNOWN);
        Offset::Offset(&local_b0,(type)Offset::UNKNOWN);
        bVar1 = Offset::isUnknown((Offset *)(local_90 + 1));
        if (bVar1) {
          Offset::Offset(&local_b8,(type)Offset::UNKNOWN);
          Offset::operator=(&local_a8,local_b8);
          local_68 = Offset::UNKNOWN;
          in_stack_fffffffffffffe98 = local_8;
        }
        else {
          tVar5 = Offset::operator*((Offset *)(local_90 + 1));
          Offset::Offset(&local_c0,tVar5);
          Offset::operator=(&local_a8,local_c0);
          in_stack_fffffffffffffe98 = local_8;
        }
        this_01 = Offset::UNKNOWN;
        tVar5 = Offset::operator*(&local_a8);
        if (local_68 <
            (set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
             *)((long)this_01 - tVar5)) {
          Offset::Offset(&local_d0,(type)local_68);
          o.offset._7_1_ = in_stack_fffffffffffffeaf;
          o.offset._0_7_ = in_stack_fffffffffffffea8;
          local_c8 = (type)Offset::operator+((Offset *)local_e0,o);
          Offset::operator=(&local_b0,(Offset)local_c8);
        }
        else {
          Offset::Offset(&local_d8,(type)Offset::UNKNOWN);
          Offset::operator=(&local_b0,local_d8);
        }
        local_e0 = (LLVMReadWriteGraphBuilder *)
                   getOperand(in_stack_fffffffffffffed0,(Value *)in_stack_fffffffffffffec8);
        if (local_e0 == (LLVMReadWriteGraphBuilder *)0x0) {
          if (createIntrinsicCall(llvm::CallInst_const*)::warned == '\0') {
            iVar3 = __cxa_guard_acquire(&createIntrinsicCall(llvm::CallInst_const*)::warned);
            if (iVar3 != 0) {
              std::
              set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
              ::set((set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                     *)0x19ffe8);
              __cxa_atexit(std::
                           set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                           ::~set,&createIntrinsicCall::warned,&__dso_handle);
              __cxa_guard_release(&createIntrinsicCall(llvm::CallInst_const*)::warned);
            }
          }
          pVar8 = std::
                  set<const_llvm::Value_*,_std::less<const_llvm::Value_*>,_std::allocator<const_llvm::Value_*>_>
                  ::insert(this_01,(value_type *)in_stack_fffffffffffffeb8);
          local_100 = (_Base_ptr)pVar8.first._M_node;
          uVar6 = pVar8.second;
          if (((undefined1  [16])pVar8 & (undefined1  [16])0x1) != (undefined1  [16])0x0) {
            os._M_node = local_100;
            llvm::errs();
            in_stack_fffffffffffffeb0 =
                 llvm::raw_ostream::operator<<
                           (in_stack_fffffffffffffeb0,
                            (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
            ValInfo::ValInfo(&local_108,in_RSI);
            operator<<((raw_ostream *)os._M_node,
                       (ValInfo *)CONCAT71(in_stack_ffffffffffffff09,uVar6));
            llvm::raw_ostream::operator<<
                      (in_stack_fffffffffffffeb0,
                       (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
            in_stack_fffffffffffffeb8 =
                 llvm::raw_ostream::operator<<
                           (in_stack_fffffffffffffeb0,
                            (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
            ValInfo::ValInfo(&local_110,(Value *)*local_90);
            operator<<((raw_ostream *)os._M_node,
                       (ValInfo *)CONCAT71(in_stack_ffffffffffffff09,uVar6));
            llvm::raw_ostream::operator<<
                      (in_stack_fffffffffffffeb0,
                       (char *)CONCAT17(in_stack_fffffffffffffeaf,in_stack_fffffffffffffea8));
          }
          local_e0 = UNKNOWN_MEMORY;
        }
        local_8 = in_stack_fffffffffffffe98;
        bVar1 = Offset::isUnknown(&local_a8);
        in_stack_fffffffffffffeaf = 0;
        if (!bVar1) {
          bVar1 = Offset::isUnknown(&local_b0);
          in_stack_fffffffffffffeaf = bVar1 ^ 0xff;
        }
        RWNode::addDef((RWNode *)in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,
                       (Offset *)this_01,(Offset *)in_stack_fffffffffffffeb8,
                       SUB81((ulong)in_stack_fffffffffffffeb0 >> 0x38,0));
      }
      LLVMPointsToSet::const_iterator::operator++((const_iterator *)local_e0);
    }
    std::pair<bool,_dg::LLVMPointsToSet>::~pair((pair<bool,_dg::LLVMPointsToSet> *)0x1a018f);
  }
  else if (IVar2 == 0x134) {
    this_00 = create(in_stack_fffffffffffffea0,t);
    uVar6 = (undefined1)((ulong)in_stack_fffffffffffffeb0 >> 0x38);
    local_8 = this_00;
    Offset::Offset((Offset *)&stack0xffffffffffffffc0,0);
    Offset::Offset(&local_48,(type)Offset::UNKNOWN);
    RWNode::addDef(this_00,in_stack_fffffffffffffec8,in_stack_fffffffffffffec0,
                   (Offset *)in_stack_fffffffffffffeb8,(bool)uVar6);
  }
  else {
    local_8 = createUnknownCall(in_stack_ffffffffffffffc8,
                                (CallInst *)in_stack_ffffffffffffffc0.offset);
  }
  return local_8;
}

Assistant:

RWNode *
LLVMReadWriteGraphBuilder::createIntrinsicCall(const llvm::CallInst *CInst) {
    using namespace llvm;

    const IntrinsicInst *I = cast<IntrinsicInst>(CInst);
    const Value *dest;
    const Value *lenVal;

    RWNode *ret;
    switch (I->getIntrinsicID()) {
    case Intrinsic::memmove:
    case Intrinsic::memcpy:
    case Intrinsic::memset:
        // memcpy/set <dest>, <src/val>, <len>
        dest = I->getOperand(0);
        lenVal = I->getOperand(2);
        break;
    case Intrinsic::vastart:
        // we create this node because this nodes works
        // as ALLOC in points-to, so we can have
        // reaching definitions to that
        ret = &create(RWNodeType::ALLOC);
        ret->addDef(ret, 0, Offset::UNKNOWN);
        return ret;
    default:
        return createUnknownCall(CInst);
    }

    ret = &create(RWNodeType::GENERIC);

    auto pts = PTA->getLLVMPointsToChecked(dest);
    if (!pts.first) {
        llvm::errs()
                << "[RWG] Error: No points-to information for destination in\n";
        llvm::errs() << ValInfo(I) << "\n";
        // continue, the points-to set is {unknown}
    }

    uint64_t len = Offset::UNKNOWN;
    if (const ConstantInt *C = dyn_cast<ConstantInt>(lenVal))
        len = C->getLimitedValue();

    for (const auto &ptr : pts.second) {
        if (llvm::isa<llvm::Function>(ptr.value))
            continue;

        Offset from, to;
        if (ptr.offset.isUnknown()) {
            // if the offset is UNKNOWN, use whole memory
            from = Offset::UNKNOWN;
            len = Offset::UNKNOWN;
        } else {
            from = *ptr.offset;
        }

        // do not allow overflow
        if (Offset::UNKNOWN - *from > len)
            to = from + len;
        else
            to = Offset::UNKNOWN;

        RWNode *target = getOperand(ptr.value);
        // assert(target && "Don't have pointer target for intrinsic call");
        if (!target) {
            // keeping such set is faster then printing it all to terminal
            // ... and we don't flood the terminal that way
            static std::set<const llvm::Value *> warned;
            if (warned.insert(ptr.value).second) {
                llvm::errs() << "[RWG] error at " << ValInfo(CInst) << "\n"
                             << "[RWG] error: Haven't created node for: "
                             << ValInfo(ptr.value) << "\n";
            }
            target = UNKNOWN_MEMORY;
        }

        // add the definition
        ret->addDef(target, from, to,
                    !from.isUnknown() && !to.isUnknown() /* strong update */);
    }

    return ret;
}